

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

void __thiscall QpVector::reset(QpVector *this)

{
  reference pvVar1;
  reference pvVar2;
  int *in_RDI;
  HighsInt i;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)*pvVar1);
    *pvVar2 = 0.0;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c);
    *pvVar1 = 0;
  }
  *in_RDI = 0;
  return;
}

Assistant:

void reset() {
    for (HighsInt i = 0; i < num_nz; i++) {
      value[index[i]] = 0;
      index[i] = 0;
    }
    num_nz = 0;
  }